

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O2

void __thiscall HawkTracer::parser::Event::merge(Event *this,Event *event)

{
  __node_base *p_Var1;
  
  p_Var1 = &(event->_values)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    set_value(this,(EventKlassField *)p_Var1[6]._M_nxt,*(FieldType *)(p_Var1 + 5));
    if (*(int *)&p_Var1[6]._M_nxt[10]._M_nxt - 9U < 2) {
      p_Var1[5]._M_nxt = (_Hash_node_base *)0x0;
    }
  }
  return;
}

Assistant:

void Event::merge(Event event)
{
    for (auto& value : event._values)
    {
        set_value(value.second.field, value.second.value);
        switch (value.second.field->get_type_id())
        {
        case FieldTypeId::STRING:
            value.second.value.f_STRING = nullptr;
            break;
        case FieldTypeId::STRUCT:
            value.second.value.f_EVENT = nullptr;
            break;
        default:
            break;
        }
    }
}